

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O3

void chunk_validate_objects(chunk_conflict *c)

{
  int iVar1;
  loc grid;
  object *poVar2;
  square *psVar3;
  monster *pmVar4;
  int y;
  int iVar5;
  
  iVar5 = c->height;
  if (0 < iVar5) {
    iVar1 = c->width;
    y = 0;
    do {
      if (0 < iVar1) {
        iVar5 = 0;
        do {
          grid = (loc)loc(iVar5,y);
          for (poVar2 = square_object(c,grid); poVar2 != (object *)0x0; poVar2 = poVar2->next) {
            if (poVar2->tval == '\0') {
              __assert_fail("obj->tval != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                            ,0x23f,"void chunk_validate_objects(struct chunk *)");
            }
          }
          psVar3 = square(c,grid);
          if (0 < psVar3->mon) {
            pmVar4 = square_monster(c,grid);
            for (poVar2 = pmVar4->held_obj; poVar2 != (object *)0x0; poVar2 = poVar2->next) {
              if (poVar2->tval == '\0') {
                __assert_fail("obj->tval != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                              ,0x244,"void chunk_validate_objects(struct chunk *)");
              }
            }
          }
          iVar5 = iVar5 + 1;
          iVar1 = c->width;
        } while (iVar5 < iVar1);
        iVar5 = c->height;
      }
      y = y + 1;
    } while (y < iVar5);
  }
  return;
}

Assistant:

void chunk_validate_objects(struct chunk *c) {
	int x, y;
	struct object *obj;

	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);
			for (obj = square_object(c, grid); obj; obj = obj->next)
				assert(obj->tval != 0);
			if (square(c, grid)->mon > 0) {
				struct monster *mon = square_monster(c, grid);
				if (mon->held_obj)
					for (obj = mon->held_obj; obj; obj = obj->next)
						assert(obj->tval != 0);
			}
		}
	}
}